

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamLogger.cpp
# Opt level: O0

StreamLogger * liblogger::GetStreamLogger(void)

{
  int iVar1;
  StreamLogger *p;
  StreamLogger *local_8;
  
  iVar1 = pthread_once(&GetStreamLogger::once,MakeKey);
  if (iVar1 != 0) {
    abort();
  }
  local_8 = (StreamLogger *)pthread_getspecific(key);
  if (local_8 == (StreamLogger *)0x0) {
    local_8 = (StreamLogger *)operator_new(400);
    StreamLogger::StreamLogger(local_8);
    pthread_setspecific(key,local_8);
  }
  return local_8;
}

Assistant:

StreamLogger &GetStreamLogger()
{
	static pthread_once_t once = PTHREAD_ONCE_INIT;
	if (pthread_once(&once, MakeKey) != 0)
		abort();
	
	StreamLogger *p = (StreamLogger *) pthread_getspecific(key);
	if (!p) {
		p = new StreamLogger();
		pthread_setspecific(key, p);
	}
	return *p;
}